

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O3

bool __thiscall VcprojGenerator::otherFiltersContain(VcprojGenerator *this,QString *fileName)

{
  char16_t *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  VCFilter *local_88 [10];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88[0] = &(this->vcProject).RootFiles;
  local_88[1] = &(this->vcProject).SourceFiles;
  local_88[2] = &(this->vcProject).HeaderFiles;
  local_88[3] = &(this->vcProject).GeneratedFiles;
  local_88[4] = &(this->vcProject).LexYaccFiles;
  local_88[5] = &(this->vcProject).TranslationFiles;
  local_88[6] = &(this->vcProject).FormFiles;
  local_88[7] = &(this->vcProject).ResourceFiles;
  local_88[8] = &(this->vcProject).DeploymentFiles;
  local_88[9] = &(this->vcProject).DistributionFiles;
  pcVar1 = (fileName->d).ptr;
  lVar2 = (fileName->d).size;
  lVar11 = 0;
  do {
    lVar3 = *(long *)(*(long *)((long)local_88 + lVar11) + 0x68);
    lVar9 = *(long *)(*(long *)((long)local_88 + lVar11) + 0x70);
    lVar7 = lVar9 * 0x20;
    lVar8 = lVar3;
    if (0 < lVar9 >> 2) {
      lVar10 = (lVar9 >> 2) + 1;
      lVar4 = lVar3 + 0x40;
      lVar9 = lVar7;
      do {
        lVar8 = lVar4;
        if ((*(long *)(lVar8 + -0x28) == lVar2) &&
           (QVar12.m_data = *(storage_type_conflict **)(lVar8 + -0x30), QVar12.m_size = lVar2,
           QVar19.m_data = pcVar1, QVar19.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar12,QVar19), cVar5 != '\0')) {
          lVar8 = lVar8 + -0x40;
          goto LAB_0024c2be;
        }
        if ((*(long *)(lVar8 + -8) == lVar2) &&
           (QVar13.m_data = *(storage_type_conflict **)(lVar8 + -0x10), QVar13.m_size = lVar2,
           QVar20.m_data = pcVar1, QVar20.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar13,QVar20), cVar5 != '\0')) {
          lVar8 = lVar8 + -0x20;
          goto LAB_0024c2be;
        }
        if ((*(long *)(lVar8 + 0x18) == lVar2) &&
           (QVar14.m_data = *(storage_type_conflict **)(lVar8 + 0x10), QVar14.m_size = lVar2,
           QVar21.m_data = pcVar1, QVar21.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar14,QVar21), cVar5 != '\0')) goto LAB_0024c2be;
        if ((*(long *)(lVar8 + 0x38) == lVar2) &&
           (QVar15.m_data = *(storage_type_conflict **)(lVar8 + 0x30), QVar15.m_size = lVar2,
           QVar22.m_data = pcVar1, QVar22.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar15,QVar22), cVar5 != '\0')) {
          lVar8 = lVar8 + 0x20;
          goto LAB_0024c2be;
        }
        lVar10 = lVar10 + -1;
        lVar9 = lVar9 + -0x80;
        lVar4 = lVar8 + 0x80;
      } while (1 < lVar10);
      lVar9 = lVar9 >> 5;
      lVar8 = lVar8 + 0x40;
    }
    if (lVar9 == 1) {
LAB_0024c287:
      if ((*(long *)(lVar8 + 0x18) == lVar2) &&
         (QVar18.m_data = *(storage_type_conflict **)(lVar8 + 0x10), QVar18.m_size = lVar2,
         QVar25.m_data = pcVar1, QVar25.m_size = lVar2,
         cVar5 = QtPrivate::equalStrings(QVar18,QVar25), cVar5 != '\0')) goto LAB_0024c2be;
    }
    else {
      if (lVar9 == 2) {
LAB_0024c262:
        if ((*(long *)(lVar8 + 0x18) != lVar2) ||
           (QVar17.m_data = *(storage_type_conflict **)(lVar8 + 0x10), QVar17.m_size = lVar2,
           QVar24.m_data = pcVar1, QVar24.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar17,QVar24), cVar5 == '\0')) {
          lVar8 = lVar8 + 0x20;
          goto LAB_0024c287;
        }
      }
      else {
        if (lVar9 != 3) goto LAB_0024c2c6;
        if ((*(long *)(lVar8 + 0x18) != lVar2) ||
           (QVar16.m_data = *(storage_type_conflict **)(lVar8 + 0x10), QVar16.m_size = lVar2,
           QVar23.m_data = pcVar1, QVar23.m_size = lVar2,
           cVar5 = QtPrivate::equalStrings(QVar16,QVar23), cVar5 == '\0')) {
          lVar8 = lVar8 + 0x20;
          goto LAB_0024c262;
        }
      }
LAB_0024c2be:
      if (lVar8 != lVar3 + lVar7) {
        bVar6 = true;
        goto LAB_0024c2da;
      }
    }
LAB_0024c2c6:
    lVar11 = lVar11 + 8;
    if (lVar11 == 0x50) {
      bVar6 = false;
LAB_0024c2da:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return bVar6;
    }
  } while( true );
}

Assistant:

bool VcprojGenerator::otherFiltersContain(const QString &fileName) const
{
    auto filterFileMatches = [&fileName] (const VCFilterFile &ff)
    {
        return ff.file == fileName;
    };
    for (const VCFilter *filter : { &vcProject.RootFiles,
                                    &vcProject.SourceFiles,
                                    &vcProject.HeaderFiles,
                                    &vcProject.GeneratedFiles,
                                    &vcProject.LexYaccFiles,
                                    &vcProject.TranslationFiles,
                                    &vcProject.FormFiles,
                                    &vcProject.ResourceFiles,
                                    &vcProject.DeploymentFiles,
                                    &vcProject.DistributionFiles}) {
        if (std::any_of(filter->Files.cbegin(), filter->Files.cend(), filterFileMatches))
            return true;
    }
    return false;
}